

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O2

void __thiscall
xLearn::RMSDMetricTest_rsmd_test_Test::RMSDMetricTest_rsmd_test_Test
          (RMSDMetricTest_rsmd_test_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00170938;
  return;
}

Assistant:

TEST(RMSDMetricTest, rsmd_test) {
  std::vector<real_t> Y;
  Y.push_back(2);
  Y.push_back(2);
  Y.push_back(2);
  Y.push_back(2);
  std::vector<real_t> pred;
  pred.push_back(1);
  pred.push_back(1);
  pred.push_back(1);
  pred.push_back(1);
  RMSDMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, 1.0);
  metric.Reset();
  Y[0] = 23;
  Y[1] = 23;
  Y[2] = 23;
  Y[3] = 23;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = 12;
  pred[3] = 12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, sqrt(121));
  EXPECT_EQ(metric.metric_type(), "RMSD");
}